

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

void __thiscall
TPZFMatrix<std::complex<float>_>::TPZFMatrix
          (TPZFMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *A)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  complex<float> *pcVar4;
  long in_RSI;
  TPZRegisterClassId *in_RDI;
  complex<float> *p;
  complex<float> *src;
  int64_t size;
  int64_t in_stack_ffffffffffffff78;
  complex<float> *pcVar5;
  int64_t in_stack_ffffffffffffff80;
  complex<float> *this_00;
  void **in_stack_ffffffffffffff88;
  ulong uVar6;
  TPZManVector<int,_5> *in_stack_ffffffffffffff90;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZFMatrix<std::complex<float>>>(in_RDI,0x21);
  TPZMatrix<std::complex<float>_>::TPZMatrix
            ((TPZMatrix<std::complex<float>_> *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  *(undefined ***)in_RDI = &PTR__TPZFMatrix_023de238;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  TPZManVector<int,_5>::TPZManVector(in_stack_ffffffffffffff90,(int64_t)in_stack_ffffffffffffff88);
  TPZVec<std::complex<float>_>::TPZVec((TPZVec<std::complex<float>_> *)(in_RDI + 0x70));
  uVar2 = *(long *)(in_RDI + 8) * *(long *)(in_RDI + 0x10);
  if (uVar2 != 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    uVar6 = uVar2;
    pcVar4 = (complex<float> *)operator_new__(uVar3);
    if (uVar6 != 0) {
      pcVar5 = pcVar4 + uVar6;
      this_00 = pcVar4;
      do {
        std::complex<float>::complex(this_00,0.0,0.0);
        this_00 = this_00 + 1;
      } while (this_00 != pcVar5);
    }
    *(complex<float> **)(in_RDI + 0x20) = pcVar4;
    memcpy(*(void **)(in_RDI + 0x20),*(void **)(in_RSI + 0x20),uVar2 * 8);
  }
  return;
}

Assistant:

TPZFMatrix<TVar>::TPZFMatrix(const TPZFMatrix<TVar> &A)
: TPZRegisterClassId(&TPZFMatrix::ClassId),
TPZMatrix<TVar>( A.fRow, A.fCol ), fElem(0), fGiven(0), fSize(0) {
    int64_t size = this->fRow * this->fCol;
    if(!size) return;
    fElem = new TVar[ size ] ;
#ifdef PZDEBUG2
    if ( size && fElem == NULL ) Error( "Constructor <memory allocation error>." );
#endif
    // Copia a matriz
    TVar * src = A.fElem;
    TVar * p = fElem;
    memcpy((void *)(p),(void *)(src),(size_t)size*sizeof(TVar));
}